

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O2

JavascriptFunction *
Js::JavascriptExceptionOperators::WalkStackForExceptionContextInternal
          (ScriptContext *scriptContext,JavascriptExceptionContext *exceptionContext,
          Var thrownObject,uint32 *callerByteCodeOffset,uint64 stackCrawlLimit,PVOID returnAddress,
          bool isThrownException,bool resetStack)

{
  size_t *this;
  JavascriptExceptionObject *pJVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint32 uVar5;
  int iVar6;
  undefined4 *puVar7;
  Recycler *alloc;
  List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  JavascriptError *pJVar8;
  ulong uVar9;
  byte initArgumentTypes;
  JavascriptFunction *this_01;
  bool bVar10;
  undefined1 local_130 [8];
  JavascriptStackWalker walker;
  TrackAllocData data;
  AutoNestedHandledExceptionType local_54;
  JavascriptFunction *pJStack_50;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  JavascriptFunction *jsFunc;
  
  JavascriptStackWalker::JavascriptStackWalker
            ((JavascriptStackWalker *)local_130,scriptContext,true,returnAddress,false);
  pJStack_50 = (JavascriptFunction *)0x0;
  BVar4 = GetCaller((JavascriptStackWalker *)local_130,&stack0xffffffffffffffb0);
  if (BVar4 == 0) {
LAB_0098c3e0:
    this_01 = (JavascriptFunction *)0x0;
    goto LAB_0098c4c6;
  }
  bVar3 = JavascriptFunction::IsLibraryCode(pJStack_50);
  if (bVar3) {
    BVar4 = JavascriptStackWalker::GetNonLibraryCodeCaller
                      ((JavascriptStackWalker *)local_130,&stack0xffffffffffffffb0);
    if (BVar4 == 0) goto LAB_0098c3e0;
  }
  this_01 = pJStack_50;
  uVar5 = JavascriptStackWalker::GetByteCodeOffset((JavascriptStackWalker *)local_130);
  *callerByteCodeOffset = uVar5;
  bVar3 = JavascriptFunction::IsLibraryCode(this_01);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x472,"(!caller->IsLibraryCode())","!caller->IsLibraryCode()");
    if (!bVar3) goto LAB_0098c6af;
    *puVar7 = 0;
  }
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_54,
             ExceptionType_JavascriptException|ExceptionType_StackOverflow|ExceptionType_OutOfMemory
            );
  walker.currentFrame.stackCheckCodeHeight =
       (size_t)&JsUtil::
                List<Js::JavascriptExceptionContext::StackFrame,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
                ::typeinfo;
  alloc = Memory::Recycler::TrackAllocInfo
                    (scriptContext->recycler,
                     (TrackAllocData *)&walker.currentFrame.stackCheckCodeHeight);
  this_00 = (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)new<Memory::Recycler>(0x30,alloc,0x37a1d4);
  (this_00->
  super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>)
  .alloc = scriptContext->recycler;
  (this_00->
  super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>)
  ._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_013868e8;
  (this_00->
  super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>)
  .buffer.ptr = (StackFrame *)0x0;
  (this_00->
  super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>)
  .count = 0;
  this_00->length = 0;
  this_00->increment = 4;
  if (stackCrawlLimit != 0) {
    if (DAT_01459494 == '\x01') {
      bVar3 = scriptContext->threadContext->hasCatchHandler;
      initArgumentTypes = bVar3 ^ 1;
      if (thrownObject != (Var)0x0 && bVar3 == false) {
        bVar3 = VarIs<Js::JavascriptError>(thrownObject);
        if (bVar3) {
          pJVar8 = VarTo<Js::JavascriptError>(thrownObject);
          walker.currentFrame.stackCheckCodeHeight = 0;
          pJVar1 = (pJVar8->exceptionObject).ptr;
          if (!resetStack) {
            iVar6 = (*(pJVar8->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x14])
                              (pJVar8,pJVar8,5,&walker.currentFrame.stackCheckCodeHeight,0,
                               scriptContext);
            if (walker.currentFrame.stackCheckCodeHeight != 0 && iVar6 != 0) {
              JavascriptExceptionContext::SetOriginalStackTrace
                        (exceptionContext,(StackTrace *)walker.currentFrame.stackCheckCodeHeight);
              goto LAB_0098c3eb;
            }
          }
          if (pJVar1 != (JavascriptExceptionObject *)0x0) {
            JavascriptExceptionContext::SetOriginalStackTrace
                      (exceptionContext,(pJVar1->exceptionContext).m_stackTrace.ptr);
          }
        }
      }
    }
    else {
      initArgumentTypes = false;
    }
LAB_0098c3eb:
    uVar9 = 1;
    this = &walker.currentFrame.stackCheckCodeHeight;
    do {
      JavascriptExceptionContext::StackFrame::StackFrame
                ((StackFrame *)this,pJStack_50,(JavascriptStackWalker *)local_130,
                 (bool)initArgumentTypes);
      JsUtil::
      List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::Add(this_00,(StackFrame *)this);
      bVar3 = JavascriptStackWalker::GetDisplayCaller
                        ((JavascriptStackWalker *)local_130,&stack0xffffffffffffffb0);
      bVar10 = uVar9 < stackCrawlLimit;
      uVar9 = uVar9 + 1;
    } while (bVar3 && bVar10);
  }
  BVar4 = JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext();
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x49d,"(JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext())",
                       "JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext()");
    if (!bVar3) {
LAB_0098c6af:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_54);
  if (this_00 !=
      (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    Memory::
    WriteBarrierPtr<JsUtil::List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
    ::WriteBarrierSet(&exceptionContext->m_stackTrace,this_00);
    DumpStackTrace(exceptionContext,isThrownException);
  }
LAB_0098c4c6:
  JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)local_130);
  return this_01;
}

Assistant:

JavascriptFunction *
    JavascriptExceptionOperators::WalkStackForExceptionContextInternal(ScriptContext& scriptContext, JavascriptExceptionContext& exceptionContext, Var thrownObject,
        uint32& callerByteCodeOffset, uint64 stackCrawlLimit, PVOID returnAddress, bool isThrownException, bool resetStack)
    {
        JavascriptStackWalker walker(&scriptContext, true, returnAddress);
        JavascriptFunction* jsFunc = nullptr;

        if (!GetCaller(walker, jsFunc))
        {
            return nullptr;
        }

        // Skip to first non-Library code
        // Similar behavior to GetCaller returning false
        if(jsFunc->IsLibraryCode() && !walker.GetNonLibraryCodeCaller(&jsFunc))
        {
            return nullptr;
        }

        JavascriptFunction * caller = jsFunc;
        callerByteCodeOffset = walker.GetByteCodeOffset();

        Assert(!caller->IsLibraryCode());
        // NOTE Don't set the throwing exception here, because we might need to box it and will cause a nested stack walker
        // instead, return it to be set in WalkStackForExceptionContext

        JavascriptExceptionContext::StackTrace *stackTrace = nullptr;
        // If we take an OOM (JavascriptException for OOM if script is active), just bail early and return what we've got
        HRESULT hr;
        BEGIN_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED
        {
            stackTrace = RecyclerNew(scriptContext.GetRecycler(), JavascriptExceptionContext::StackTrace, scriptContext.GetRecycler());
            if (stackCrawlLimit > 0)
            {
                const bool crawlStackForWER = CrawlStackForWER(scriptContext);

                // In WER scenario, we should combine the original stack with latest throw stack as the final throw might be coming form
                // a different stack.
                uint64 i = 1;
                if (crawlStackForWER && thrownObject && Js::VarIs<Js::JavascriptError>(thrownObject))
                {
                    Js::JavascriptError* errorObject = Js::VarTo<Js::JavascriptError>(thrownObject);
                    Js::JavascriptExceptionContext::StackTrace *originalStackTrace = NULL;
                    const Js::JavascriptExceptionObject* originalExceptionObject = errorObject->GetJavascriptExceptionObject();
                    if (!resetStack && errorObject->GetInternalProperty(errorObject, InternalPropertyIds::StackTrace, (Js::Var*) &originalStackTrace, NULL, &scriptContext) &&
                        (originalStackTrace != nullptr))
                    {
                        exceptionContext.SetOriginalStackTrace(originalStackTrace);
                    }
                    else
                    {
                        if (originalExceptionObject != nullptr)
                        {
                            exceptionContext.SetOriginalStackTrace(originalExceptionObject->GetExceptionContext()->GetStackTrace());
                        }
                    }
                }

                do
                {
                    JavascriptExceptionContext::StackFrame stackFrame(jsFunc, walker, crawlStackForWER);
                    stackTrace->Add(stackFrame);
                } while (walker.GetDisplayCaller(&jsFunc) && i++ < stackCrawlLimit);
            }
        }